

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMath.cpp
# Opt level: O3

Box<Dims> *
adios2::helper::IntersectionBox(Box<Dims> *__return_storage_ptr__,Box<Dims> *box1,Box<Dims> *box2)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  iterator iVar4;
  long lVar5;
  ulong uVar6;
  size_type __n;
  long lVar7;
  
  (__return_storage_ptr__->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = (box1->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (box1->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __n = (long)puVar2 - (long)puVar1 >> 3;
  if (puVar2 != puVar1) {
    lVar5 = 0;
    do {
      if ((box1->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5] <
          (box2->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5]) {
        return __return_storage_ptr__;
      }
      if ((box2->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5] < puVar1[lVar5]) {
        return __return_storage_ptr__;
      }
      lVar5 = lVar5 + 1;
    } while (__n + (__n == 0) != lVar5);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&__return_storage_ptr__->first,__n);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&__return_storage_ptr__->second,__n);
  if (puVar2 != puVar1) {
    lVar7 = __n + (__n == 0);
    lVar5 = 0;
    do {
      puVar1 = (box1->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar3 = *(ulong *)((long)puVar1 + lVar5);
      puVar2 = (box2->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(ulong *)((long)puVar2 + lVar5);
      iVar4._M_current =
           (__return_storage_ptr__->first).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (__return_storage_ptr__->first).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        if (uVar6 <= uVar3) {
          puVar2 = puVar1;
        }
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,
                   iVar4,(unsigned_long *)((long)puVar2 + lVar5));
      }
      else {
        if (uVar6 < uVar3) {
          uVar6 = uVar3;
        }
        *iVar4._M_current = uVar6;
        (__return_storage_ptr__->first).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      puVar1 = (box1->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar3 = *(ulong *)((long)puVar1 + lVar5);
      puVar2 = (box2->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar6 = *(ulong *)((long)puVar2 + lVar5);
      iVar4._M_current =
           (__return_storage_ptr__->second).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (__return_storage_ptr__->second).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        if (uVar3 <= uVar6) {
          puVar2 = puVar1;
        }
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                   &__return_storage_ptr__->second,iVar4,(unsigned_long *)((long)puVar2 + lVar5));
      }
      else {
        if (uVar3 < uVar6) {
          uVar6 = uVar3;
        }
        *iVar4._M_current = uVar6;
        (__return_storage_ptr__->second).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      lVar5 = lVar5 + 8;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

Box<Dims> IntersectionBox(const Box<Dims> &box1, const Box<Dims> &box2) noexcept
{
    Box<Dims> intersectionBox;
    const size_t dimensionsSize = box1.first.size();

    for (size_t d = 0; d < dimensionsSize; ++d)
    {
        // Don't intercept
        if (box2.first[d] > box1.second[d] || box2.second[d] < box1.first[d])
        {
            return intersectionBox;
        }
    }

    // get the intersection box
    intersectionBox.first.reserve(dimensionsSize);
    intersectionBox.second.reserve(dimensionsSize);

    for (size_t d = 0; d < dimensionsSize; ++d)
    {
        // start
        if (box1.first[d] < box2.first[d])
        {
            intersectionBox.first.push_back(box2.first[d]);
        }
        else
        {
            intersectionBox.first.push_back(box1.first[d]);
        }

        // end, must be inclusive
        if (box1.second[d] > box2.second[d])
        {
            intersectionBox.second.push_back(box2.second[d]);
        }
        else
        {
            intersectionBox.second.push_back(box1.second[d]);
        }
    }

    return intersectionBox;
}